

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook>
capnp::_::WireHelpers::readCapabilityPointer
          (SegmentReader *segment,CapTableReader *capTable,WirePointer *ref,int nestingLimit)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  Own<capnp::ClientHook> *pOVar4;
  undefined4 in_register_0000000c;
  WirePointer *this;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> OVar5;
  StringPtr local_a8;
  Fault local_98;
  Fault f_2;
  undefined1 local_80 [8];
  OwnOwn<capnp::ClientHook> cap;
  undefined8 local_68;
  Fault local_60;
  Fault f_1;
  Fault local_48;
  Fault f;
  Maybe<kj::Own<capnp::ClientHook>_> maybeCap;
  int nestingLimit_local;
  WirePointer *ref_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  this = (WirePointer *)CONCAT44(in_register_0000000c,nestingLimit);
  kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)&f);
  if (brokenCapFactory != (long *)0x0) {
    bVar2 = WirePointer::isNull(this);
    if (bVar2) {
      (**(code **)(*brokenCapFactory + 8))(segment);
      f_1.exception._0_4_ = 1;
    }
    else {
      bVar2 = WirePointer::isCapability(this);
      if (bVar2) {
        uVar3 = DirectWireValue<unsigned_int>::get
                          ((DirectWireValue<unsigned_int> *)&(this->field_1).structRef);
        (**(code **)*ref)(&f_2,ref,uVar3);
        kj::_::readMaybe<capnp::ClientHook>
                  ((_ *)local_80,(Maybe<kj::Own<capnp::ClientHook>_> *)&f_2);
        kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)&f_2);
        pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_80);
        if (pOVar4 == (Own<capnp::ClientHook> *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                    (&local_98,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x8a1,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                     (char (*) [45])"Message contains invalid capability pointer.");
          f_1.exception._0_4_ = 8;
          kj::_::Debug::Fault::~Fault(&local_98);
          plVar1 = brokenCapFactory;
          kj::StringPtr::StringPtr(&local_a8,"Calling invalid capability pointer.");
          (**(code **)*plVar1)(segment,plVar1,local_a8.content.ptr,local_a8.content.size_);
        }
        else {
          pOVar4 = kj::_::OwnOwn<capnp::ClientHook>::operator*
                             ((OwnOwn<capnp::ClientHook> *)local_80);
          pOVar4 = kj::mv<kj::Own<capnp::ClientHook>>(pOVar4);
          kj::Own<capnp::ClientHook>::Own((Own<capnp::ClientHook> *)segment,pOVar4);
        }
        f_1.exception._0_4_ = 1;
        kj::_::OwnOwn<capnp::ClientHook>::~OwnOwn((OwnOwn<capnp::ClientHook> *)local_80);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[79]>
                  (&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x899,FAILED,(char *)0x0,
                   "\"Message contains non-capability pointer where capability pointer was expected.\""
                   ,(char (*) [79])
                    "Message contains non-capability pointer where capability pointer was expected."
                  );
        f_1.exception._0_4_ = 5;
        kj::_::Debug::Fault::~Fault(&local_60);
        plVar1 = brokenCapFactory;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&cap.value.ptr,
                   "Calling capability extracted from a non-capability pointer.");
        (**(code **)*plVar1)(segment,plVar1,cap.value.ptr,local_68);
        f_1.exception._0_4_ = 1;
      }
    }
    kj::Maybe<kj::Own<capnp::ClientHook>_>::~Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)&f);
    OVar5.ptr = extraout_RDX;
    OVar5.disposer = (Disposer *)segment;
    return OVar5;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[192]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0x893,FAILED,"brokenCapFactory != nullptr",
             "\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
             ,(char (*) [192])
              "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
            );
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

static KJ_ALWAYS_INLINE(kj::Own<ClientHook> readCapabilityPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, int nestingLimit)) {
    kj::Maybe<kj::Own<ClientHook>> maybeCap;

    KJ_REQUIRE(brokenCapFactory != nullptr,
               "Trying to read capabilities without ever having created a capability context.  "
               "To read capabilities from a message, you must imbue it with CapReaderContext, or "
               "use the Cap'n Proto RPC system.");

    if (ref->isNull()) {
      return brokenCapFactory->newNullCap();
    } else if (!ref->isCapability()) {
      KJ_FAIL_REQUIRE(
          "Message contains non-capability pointer where capability pointer was expected.") {
        break;
      }
      return brokenCapFactory->newBrokenCap(
          "Calling capability extracted from a non-capability pointer.");
    } else KJ_IF_MAYBE(cap, capTable->extractCap(ref->capRef.index.get())) {
      return kj::mv(*cap);
    } else {
      KJ_FAIL_REQUIRE("Message contains invalid capability pointer.") {
        break;
      }